

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ami_nvar.cpp
# Opt level: O0

void __thiscall ami_nvar_t::nvar_entry_t::_clean_up(nvar_entry_t *this)

{
  nvar_entry_t *this_local;
  
  return;
}

Assistant:

void ami_nvar_t::nvar_entry_t::_clean_up() {
    if (!n_invoke_offset) {
    }
    if (!n_signature_rest) {
    }
    if (!n_size) {
    }
    if (!n_next) {
    }
    if (!n_attributes) {
    }
    if (!n_body) {
    }
    if (!n_invoke_end_offset) {
    }
}